

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::CustomModel::ByteSizeLong(CustomModel *this)

{
  bool bVar1;
  int iVar2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *pMVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  const_pointer pvVar4;
  ulong uVar5;
  string *psVar6;
  size_t sVar7;
  long lVar8;
  undefined1 local_50 [4];
  int cached_size;
  undefined1 local_38 [8];
  const_iterator it;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  CustomModel *this_local;
  
  it.it_.bucket_index_._4_4_ = 0;
  iVar2 = _internal_parameters_size(this);
  sStack_18 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_18 = sStack_18 * 2;
  pMVar3 = _internal_parameters_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  ::begin((const_iterator *)local_38,pMVar3);
  while( true ) {
    pMVar3 = _internal_parameters_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::end((const_iterator *)local_50,pMVar3);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_38,(const_iterator *)local_50);
    if (!bVar1) break;
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
          ::const_iterator::operator->((const_iterator *)local_38);
    pvVar4 = google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
             ::const_iterator::operator->((const_iterator *)local_38);
    sVar7 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(key,(CustomModel_CustomModelParamValue *)(pvVar4 + 0x20));
    sStack_18 = sVar7 + sStack_18;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
    ::const_iterator::operator++((const_iterator *)local_38);
  }
  _internal_classname_abi_cxx11_(this);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    psVar6 = _internal_classname_abi_cxx11_(this);
    sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sStack_18 = sVar7 + 1 + sStack_18;
  }
  _internal_description_abi_cxx11_(this);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    psVar6 = _internal_description_abi_cxx11_(this);
    sVar7 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    sStack_18 = sVar7 + 2 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar8 = std::__cxx11::string::size();
    sStack_18 = lVar8 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t CustomModel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomModel)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // map<string, .CoreML.Specification.CustomModel.CustomModelParamValue> parameters = 30;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_parameters_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::CustomModel_CustomModelParamValue >::const_iterator
      it = this->_internal_parameters().begin();
      it != this->_internal_parameters().end(); ++it) {
    total_size += CustomModel_ParametersEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string className = 10;
  if (!this->_internal_classname().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_classname());
  }

  // string description = 40;
  if (!this->_internal_description().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_description());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}